

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Viper.cpp
# Opt level: O2

void __thiscall chrono::viper::ViperPart::Construct(ViperPart *this,ChSystem *system)

{
  shared_ptr<chrono::ChBodyAuxRef> *this_00;
  element_type *peVar1;
  element_type *peVar2;
  double dVar3;
  ChBodyAuxRef *__p;
  shared_ptr<chrono::geometry::ChTriangleMeshConnected> trimesh_col;
  shared_ptr<chrono::ChTriangleMeshShape> trimesh_shape;
  shared_ptr<chrono::geometry::ChTriangleMeshConnected> trimesh_vis;
  __shared_ptr<chrono::geometry::ChTriangleMesh,(__gnu_cxx::_Lock_policy)2> local_218 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_210;
  __shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2> local_208;
  __shared_ptr<chrono::ChVisualShape,(__gnu_cxx::_Lock_policy)2> local_1f8 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_1f0;
  string vis_mesh_file;
  __shared_ptr<chrono::ChBody,(__gnu_cxx::_Lock_policy)2> local_1c8 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_1c0;
  __shared_ptr<chrono::geometry::ChTriangleMeshConnected,_(__gnu_cxx::_Lock_policy)2> local_1b8;
  ChVector<double> local_1a8;
  ChFrame<double> local_190;
  double local_108;
  double dStack_100;
  double local_f8;
  double local_e8;
  double dStack_e0;
  double local_d8;
  double local_c8;
  double dStack_c0;
  double dStack_b8;
  double dStack_b0;
  double dStack_a8;
  double dStack_a0;
  double dStack_98;
  double dStack_90;
  double local_88;
  double local_78;
  double dStack_70;
  double dStack_68;
  double dStack_60;
  double dStack_58;
  double dStack_50;
  double dStack_48;
  double dStack_40;
  double local_38;
  
  __p = (ChBodyAuxRef *)(**(code **)(*(long *)system + 0x188))(system);
  std::__shared_ptr<chrono::ChBodyAuxRef,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<chrono::ChBodyAuxRef,void>
            ((__shared_ptr<chrono::ChBodyAuxRef,(__gnu_cxx::_Lock_policy)2> *)&local_190,__p);
  this_00 = &this->m_body;
  std::__shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&this_00->super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>,
             (__shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2> *)&local_190);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_190.coord);
  peVar1 = (this->m_body).super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_190,
                 &this->m_name,"_body");
  std::__cxx11::string::_M_assign((string *)(peVar1 + 8));
  std::__cxx11::string::~string((string *)&local_190);
  chrono::ChVariablesBodyOwnMass::SetBodyMass(this->m_mass);
  chrono::ChBody::SetInertiaXX
            ((this->m_body).super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr);
  chrono::ChBodyAuxRef::SetFrame_COG_to_REF
            ((ChFrame *)
             (this->m_body).super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr);
  if (this->m_visualize == true) {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&trimesh_col
                   ,"robot/viper/obj/",&this->m_mesh_name);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_190,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&trimesh_col
                   ,".obj");
    chrono::GetChronoDataFile((string *)&vis_mesh_file);
    std::__cxx11::string::~string((string *)&local_190);
    std::__cxx11::string::~string((string *)&trimesh_col);
    chrono::geometry::ChTriangleMeshConnected::CreateFromWavefrontFile
              ((string *)&trimesh_vis,SUB81(&vis_mesh_file,0),true);
    local_e8 = (this->m_mesh_xform).coord.pos.m_data[0];
    dStack_e0 = (this->m_mesh_xform).coord.pos.m_data[1];
    local_d8 = (this->m_mesh_xform).coord.pos.m_data[2];
    local_38 = *(double *)
                ((long)(this->m_mesh_xform).Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data
                       .array + 0x40);
    local_78 = (this->m_mesh_xform).Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
               [0];
    dStack_70 = *(double *)
                 ((long)(this->m_mesh_xform).Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                        super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                        m_data.array + 8);
    dStack_68 = *(double *)
                 ((long)(this->m_mesh_xform).Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                        super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                        m_data.array + 0x10);
    dStack_60 = *(double *)
                 ((long)(this->m_mesh_xform).Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                        super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                        m_data.array + 0x18);
    dStack_58 = *(double *)
                 ((long)(this->m_mesh_xform).Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                        super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                        m_data.array + 0x20);
    dStack_50 = *(double *)
                 ((long)(this->m_mesh_xform).Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                        super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                        m_data.array + 0x28);
    dStack_48 = *(double *)
                 ((long)(this->m_mesh_xform).Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                        super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                        m_data.array + 0x30);
    dStack_40 = *(double *)
                 ((long)(this->m_mesh_xform).Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                        super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                        m_data.array + 0x38);
    (**(code **)(*(long *)trimesh_vis.
                          super___shared_ptr<chrono::geometry::ChTriangleMeshConnected,_(__gnu_cxx::_Lock_policy)2>
                          ._M_ptr + 0x80))();
    chrono::geometry::ChTriangleMeshConnected::RepairDuplicateVertexes(1e-09);
    chrono_types::make_shared<chrono::ChTriangleMeshShape,_0>();
    peVar2 = trimesh_shape.
             super___shared_ptr<chrono::ChTriangleMeshShape,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    std::__shared_ptr<chrono::geometry::ChTriangleMeshConnected,_(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr(&local_1b8,
                 &trimesh_vis.
                  super___shared_ptr<chrono::geometry::ChTriangleMeshConnected,_(__gnu_cxx::_Lock_policy)2>
                );
    chrono::ChTriangleMeshShape::SetMesh(peVar2,&local_1b8,1);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_1b8._M_refcount);
    std::__cxx11::string::_M_assign
              ((string *)
               (trimesh_shape.
                super___shared_ptr<chrono::ChTriangleMeshShape,_(__gnu_cxx::_Lock_policy)2>._M_ptr +
               0x40));
    trimesh_shape.super___shared_ptr<chrono::ChTriangleMeshShape,_(__gnu_cxx::_Lock_policy)2>._M_ptr
    [9] = (element_type)0x0;
    peVar1 = (this_00->super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    std::__shared_ptr<chrono::ChVisualShape,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<chrono::ChTriangleMeshShape,void>
              (local_1f8,
               &trimesh_shape.
                super___shared_ptr<chrono::ChTriangleMeshShape,_(__gnu_cxx::_Lock_policy)2>);
    trimesh_col.
    super___shared_ptr<chrono::geometry::ChTriangleMeshConnected,_(__gnu_cxx::_Lock_policy)2>._M_ptr
         = (element_type *)&DAT_3ff0000000000000;
    local_1a8.m_data[2] = 0.0;
    local_1a8.m_data[0] = 0.0;
    local_1a8.m_data[1] = 0.0;
    trimesh_col.
    super___shared_ptr<chrono::geometry::ChTriangleMeshConnected,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    ChFrame<double>::ChFrame(&local_190,&local_1a8,(ChQuaternion<double> *)&trimesh_col);
    chrono::ChPhysicsItem::AddVisualShape(peVar1,local_1f8,&local_190);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_1f0);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&trimesh_shape.
                super___shared_ptr<chrono::ChTriangleMeshShape,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&trimesh_vis.
                super___shared_ptr<chrono::geometry::ChTriangleMeshConnected,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount);
    std::__cxx11::string::~string((string *)&vis_mesh_file);
  }
  if (this->m_collide == true) {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&trimesh_col
                   ,"robot/viper/col/",&this->m_mesh_name);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_190,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&trimesh_col
                   ,".obj");
    chrono::GetChronoDataFile((string *)&vis_mesh_file);
    std::__cxx11::string::~string((string *)&local_190);
    std::__cxx11::string::~string((string *)&trimesh_col);
    chrono::geometry::ChTriangleMeshConnected::CreateFromWavefrontFile
              ((string *)&trimesh_col,SUB81(&vis_mesh_file,0),false);
    local_108 = (this->m_mesh_xform).coord.pos.m_data[0];
    dStack_100 = (this->m_mesh_xform).coord.pos.m_data[1];
    local_f8 = (this->m_mesh_xform).coord.pos.m_data[2];
    local_88 = *(double *)
                ((long)(this->m_mesh_xform).Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data
                       .array + 0x40);
    local_c8 = (this->m_mesh_xform).Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
               [0];
    dStack_c0 = *(double *)
                 ((long)(this->m_mesh_xform).Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                        super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                        m_data.array + 8);
    dStack_b8 = *(double *)
                 ((long)(this->m_mesh_xform).Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                        super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                        m_data.array + 0x10);
    dStack_b0 = *(double *)
                 ((long)(this->m_mesh_xform).Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                        super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                        m_data.array + 0x18);
    dStack_a8 = *(double *)
                 ((long)(this->m_mesh_xform).Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                        super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                        m_data.array + 0x20);
    dStack_a0 = *(double *)
                 ((long)(this->m_mesh_xform).Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                        super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                        m_data.array + 0x28);
    dStack_98 = *(double *)
                 ((long)(this->m_mesh_xform).Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                        super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                        m_data.array + 0x30);
    dStack_90 = *(double *)
                 ((long)(this->m_mesh_xform).Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                        super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                        m_data.array + 0x38);
    (**(code **)(*(long *)trimesh_col.
                          super___shared_ptr<chrono::geometry::ChTriangleMeshConnected,_(__gnu_cxx::_Lock_policy)2>
                          ._M_ptr + 0x80))();
    chrono::geometry::ChTriangleMeshConnected::RepairDuplicateVertexes(1e-09);
    std::__shared_ptr<chrono::collision::ChCollisionModel,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<chrono::collision::ChCollisionModel,_(__gnu_cxx::_Lock_policy)2> *)
               &local_190,
               (__shared_ptr<chrono::collision::ChCollisionModel,_(__gnu_cxx::_Lock_policy)2> *)
               ((this_00->super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>).
                _M_ptr + 0x198));
    (**(code **)(*local_190._vptr_ChFrame + 0x18))();
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_190.coord);
    std::__shared_ptr<chrono::collision::ChCollisionModel,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<chrono::collision::ChCollisionModel,_(__gnu_cxx::_Lock_policy)2> *)
               &local_1a8,
               (__shared_ptr<chrono::collision::ChCollisionModel,_(__gnu_cxx::_Lock_policy)2> *)
               ((this->m_body).super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr + 0x198));
    dVar3 = local_1a8.m_data[0];
    std::__shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_208,
               &(this->m_mat).
                super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>);
    std::__shared_ptr<chrono::geometry::ChTriangleMesh,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<chrono::geometry::ChTriangleMeshConnected,void>
              (local_218,
               &trimesh_col.
                super___shared_ptr<chrono::geometry::ChTriangleMeshConnected,_(__gnu_cxx::_Lock_policy)2>
              );
    ChMatrix33<double>::ChMatrix33((ChMatrix33<double> *)&local_190,1.0);
    (**(code **)(*(long *)dVar3 + 0x80))
              (0x3f747ae147ae147b,dVar3,&local_208,local_218,0,0,&VNULL,&local_190);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_210);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_208._M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_1a8.m_data + 1));
    std::__shared_ptr<chrono::collision::ChCollisionModel,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<chrono::collision::ChCollisionModel,_(__gnu_cxx::_Lock_policy)2> *)
               &local_190,
               (__shared_ptr<chrono::collision::ChCollisionModel,_(__gnu_cxx::_Lock_policy)2> *)
               ((this_00->super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>).
                _M_ptr + 0x198));
    (**(code **)(*local_190._vptr_ChFrame + 0x20))();
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_190.coord);
    chrono::ChBody::SetCollide
              (SUB81((this->m_body).
                     super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>._M_ptr,0))
    ;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&trimesh_col.
                super___shared_ptr<chrono::geometry::ChTriangleMeshConnected,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount);
    std::__cxx11::string::~string((string *)&vis_mesh_file);
  }
  std::__shared_ptr<chrono::ChBody,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<chrono::ChBodyAuxRef,void>
            (local_1c8,
             &this_00->super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>);
  (**(code **)(*(long *)system + 0x128))(system,local_1c8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_1c0);
  return;
}

Assistant:

void ViperPart::Construct(ChSystem* system) {
    m_body = std::shared_ptr<ChBodyAuxRef>(system->NewBodyAuxRef());
    m_body->SetNameString(m_name + "_body");
    m_body->SetMass(m_mass);
    m_body->SetInertiaXX(m_inertia);
    m_body->SetFrame_COG_to_REF(m_cog);

    // Add visualization shape
    if (m_visualize) {
        auto vis_mesh_file = GetChronoDataFile("robot/viper/obj/" + m_mesh_name + ".obj");
        auto trimesh_vis = geometry::ChTriangleMeshConnected::CreateFromWavefrontFile(vis_mesh_file, true, true);
        trimesh_vis->Transform(m_mesh_xform.GetPos(), m_mesh_xform.GetA());  // translate/rotate/scale mesh
        trimesh_vis->RepairDuplicateVertexes(1e-9);                          // if meshes are not watertight

        auto trimesh_shape = chrono_types::make_shared<ChTriangleMeshShape>();
        trimesh_shape->SetMesh(trimesh_vis);
        trimesh_shape->SetName(m_mesh_name);
        trimesh_shape->SetMutable(false);
        m_body->AddVisualShape(trimesh_shape);
    }

    // Add collision shape
    if (m_collide) {
        auto col_mesh_file = GetChronoDataFile("robot/viper/col/" + m_mesh_name + ".obj");
        auto trimesh_col = geometry::ChTriangleMeshConnected::CreateFromWavefrontFile(col_mesh_file, false, false);
        trimesh_col->Transform(m_mesh_xform.GetPos(), m_mesh_xform.GetA());  // translate/rotate/scale mesh
        trimesh_col->RepairDuplicateVertexes(1e-9);                          // if meshes are not watertight

        m_body->GetCollisionModel()->ClearModel();
        m_body->GetCollisionModel()->AddTriangleMesh(m_mat, trimesh_col, false, false, VNULL, ChMatrix33<>(1), 0.005);
        m_body->GetCollisionModel()->BuildModel();
        m_body->SetCollide(m_collide);
    }

    system->AddBody(m_body);
}